

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O0

idx_t duckdb::FixedSizeAppend<unsigned_long,duckdb::StandardFixedSizeAppend>
                (CompressionAppendState *append_state,ColumnSegment *segment,
                SegmentStatistics *stats,UnifiedVectorFormat *data,idx_t offset,idx_t count)

{
  idx_t iVar1;
  __int_type _Var2;
  unsigned_long __i;
  idx_t in_RCX;
  UnifiedVectorFormat *in_RDX;
  ColumnSegment *in_RSI;
  data_ptr_t in_RDI;
  idx_t in_R8;
  unsigned_long in_R9;
  SegmentStatistics *unaff_retaddr;
  idx_t copy_count;
  idx_t max_tuple_count;
  data_ptr_t target_ptr;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffffa8;
  
  BufferHandle::Ptr((BufferHandle *)0xa41300);
  iVar1 = ColumnSegment::SegmentSize(in_RSI);
  _Var2 = ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffffa8);
  __i = MinValue<unsigned_long>(in_R9,(iVar1 >> 3) - _Var2);
  ::std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)in_RDX);
  StandardFixedSizeAppend::Append<unsigned_long>
            (unaff_retaddr,in_RDI,(idx_t)in_RSI,in_RDX,in_RCX,in_R8);
  ::std::__atomic_base<unsigned_long>::operator+=
            (&(in_RSI->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>,__i);
  return __i;
}

Assistant:

idx_t FixedSizeAppend(CompressionAppendState &append_state, ColumnSegment &segment, SegmentStatistics &stats,
                      UnifiedVectorFormat &data, idx_t offset, idx_t count) {
	D_ASSERT(segment.GetBlockOffset() == 0);

	auto target_ptr = append_state.handle.Ptr();
	idx_t max_tuple_count = segment.SegmentSize() / sizeof(T);
	idx_t copy_count = MinValue<idx_t>(count, max_tuple_count - segment.count);

	OP::template Append<T>(stats, target_ptr, segment.count, data, offset, copy_count);
	segment.count += copy_count;
	return copy_count;
}